

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

List<Kernel::TermList> ** __thiscall
Lib::Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash>::insert
          (Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash> *this,uint *key,
          List<Kernel::TermList> **val,uint code)

{
  Entry *pEVar1;
  MaybeUninit<Lib::List<Kernel::TermList>_*> MVar2;
  ulong uVar3;
  Entry *pEVar4;
  uint uVar5;
  
  pEVar1 = this->_entries;
  uVar3 = (ulong)code % (ulong)(uint)this->_capacity;
  pEVar4 = pEVar1 + uVar3;
  uVar5 = pEVar1[uVar3].code;
  if (uVar5 != 0) {
    do {
      if ((uVar5 == code) && (pEVar4->_key == (MaybeUninit<unsigned_int>)*key)) {
        return (List<Kernel::TermList> **)&pEVar4->_value;
      }
      pEVar4 = pEVar4 + 1;
      if (pEVar4 == this->_afterLast) {
        pEVar4 = pEVar1;
      }
      uVar5 = pEVar4->code;
    } while (uVar5 != 0);
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  MVar2 = (MaybeUninit<Lib::List<Kernel::TermList>_*>)*val;
  pEVar4->_key = (MaybeUninit<unsigned_int>)*key;
  pEVar4->_value = MVar2;
  pEVar4->code = code;
  return (List<Kernel::TermList> **)&pEVar4->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }